

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c
# Opt level: O3

int uv_async_init(uv_loop_t *loop,uv_async_t *handle,uv_async_cb async_cb)

{
  uint *puVar1;
  long *plVar2;
  int iVar3;
  
  iVar3 = uv__async_start(loop);
  if (iVar3 == 0) {
    handle->loop = loop;
    handle->type = UV_ASYNC;
    handle->handle_queue[0] = loop->handle_queue;
    plVar2 = (long *)loop->handle_queue[1];
    handle->handle_queue[1] = plVar2;
    *plVar2 = (long)handle->handle_queue;
    loop->handle_queue[1] = handle->handle_queue;
    handle->next_closing = (uv_handle_t *)0x0;
    handle->async_cb = async_cb;
    handle->pending = 0;
    handle->queue[0] = loop->async_handles;
    plVar2 = (long *)loop->async_handles[1];
    handle->queue[1] = plVar2;
    *plVar2 = (long)handle->queue;
    loop->async_handles[1] = handle->queue;
    handle->flags = 0x6000;
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 + 1;
  }
  return iVar3;
}

Assistant:

int uv_async_init(uv_loop_t* loop, uv_async_t* handle, uv_async_cb async_cb) {
  int err;

  err = uv__async_start(loop);
  if (err)
    return err;

  uv__handle_init(loop, (uv_handle_t*)handle, UV_ASYNC);
  handle->async_cb = async_cb;
  handle->pending = 0;

  QUEUE_INSERT_TAIL(&loop->async_handles, &handle->queue);
  uv__handle_start(handle);

  return 0;
}